

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

void ZSTD_safecopyDstBeforeSrc(BYTE *op,BYTE *ip,ptrdiff_t length)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  BYTE BVar4;
  undefined8 uVar5;
  BYTE *oend;
  long lVar6;
  
  pBVar2 = op + length;
  if (length < 8 || -8 < (long)op - (long)ip) {
    if (0 < length) {
      do {
        BVar4 = *ip;
        ip = ip + 1;
        *op = BVar4;
        op = op + 1;
      } while (op < pBVar2);
    }
  }
  else {
    pBVar1 = pBVar2 + -0x20;
    if ((ulong)((long)op - (long)ip) < 0xfffffffffffffff0 && op <= pBVar1) {
      uVar5 = *(undefined8 *)(ip + 8);
      *(undefined8 *)op = *(undefined8 *)ip;
      *(undefined8 *)(op + 8) = uVar5;
      if (0x10 < (long)pBVar1 - (long)op) {
        lVar6 = 0x10;
        do {
          uVar5 = *(undefined8 *)(ip + lVar6 + 8);
          pBVar3 = op + lVar6;
          *(undefined8 *)pBVar3 = *(undefined8 *)(ip + lVar6);
          *(undefined8 *)(pBVar3 + 8) = uVar5;
          uVar5 = *(undefined8 *)(ip + lVar6 + 0x10 + 8);
          *(undefined8 *)(pBVar3 + 0x10) = *(undefined8 *)(ip + lVar6 + 0x10);
          *(undefined8 *)(pBVar3 + 0x18) = uVar5;
          lVar6 = lVar6 + 0x20;
        } while (pBVar3 + 0x20 < pBVar1);
      }
      ip = ip + ((long)pBVar1 - (long)op);
      op = pBVar1;
    }
    else if (length < 1) {
      return;
    }
    do {
      BVar4 = *ip;
      ip = ip + 1;
      *op = BVar4;
      op = op + 1;
    } while (op < pBVar2);
  }
  return;
}

Assistant:

static void ZSTD_safecopyDstBeforeSrc(BYTE* op, BYTE const* ip, ptrdiff_t length) {
    ptrdiff_t const diff = op - ip;
    BYTE* const oend = op + length;

    if (length < 8 || diff > -8) {
        /* Handle short lengths, close overlaps, and dst not before src. */
        while (op < oend) *op++ = *ip++;
        return;
    }

    if (op <= oend - WILDCOPY_OVERLENGTH && diff < -WILDCOPY_VECLEN) {
        ZSTD_wildcopy(op, ip, oend - WILDCOPY_OVERLENGTH - op, ZSTD_no_overlap);
        ip += oend - WILDCOPY_OVERLENGTH - op;
        op += oend - WILDCOPY_OVERLENGTH - op;
    }

    /* Handle the leftovers. */
    while (op < oend) *op++ = *ip++;
}